

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_session.hpp
# Opt level: O1

string * binlog::detail::this_thread_id_string_abi_cxx11_(void)

{
  pthread_t pVar1;
  string *in_RDI;
  ostringstream str;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  pVar1 = pthread_self();
  if (pVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"thread::id of a non-executing thread",0x24);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_180);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return in_RDI;
}

Assistant:

inline std::string this_thread_id_string()
{
  std::ostringstream str;
  str << std::this_thread::get_id();
  return str.str();
}